

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O1

bool __thiscall LinearScan::SkipNumberedInstr(LinearScan *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  uint32 uVar4;
  undefined4 *puVar5;
  
  if ((instr->m_kind == InstrKindProfiledLabel) || (instr->m_kind == InstrKindLabel)) {
    if (((ulong)instr[1].m_func & 1) == 0) {
      return true;
    }
    uVar3 = IR::Instr::GetNumber(instr);
    uVar4 = IR::Instr::GetNumber(instr->m_next);
    if (uVar3 != uVar4) {
      uVar3 = IR::Instr::GetNumber(instr);
      uVar4 = IR::Instr::GetNumber(instr->m_prev);
      if (uVar3 != uVar4) {
        return false;
      }
      if (instr->m_prev->m_opcode == Nop) {
        return false;
      }
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x92b,
                       "(instr->GetNumber() != instr->m_next->GetNumber() && (instr->GetNumber() != instr->m_prev->GetNumber() || instr->m_prev->m_opcode == Js::OpCode::Nop))"
                       ,
                       "instr->GetNumber() != instr->m_next->GetNumber() && (instr->GetNumber() != instr->m_prev->GetNumber() || instr->m_prev->m_opcode == Js::OpCode::Nop)"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  return false;
}

Assistant:

bool
LinearScan::SkipNumberedInstr(IR::Instr *instr)
{
    if (instr->IsLabelInstr())
    {
        if (instr->AsLabelInstr()->m_isLoopTop)
        {
            Assert(instr->GetNumber() != instr->m_next->GetNumber()
                && (instr->GetNumber() != instr->m_prev->GetNumber() || instr->m_prev->m_opcode == Js::OpCode::Nop));
        }
        else
        {
            return true;
        }
    }
    return false;
}